

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qabstractanimation.cpp
# Opt level: O1

void QAnimationTimer::updateAnimationTimer(void)

{
  long lVar1;
  
  lVar1 = __tls_get_addr(&PTR_006ba338);
  if (*(char *)(lVar1 + 0x80) == '\0') {
    updateAnimationTimer();
  }
  if (*(long **)(lVar1 + 0x78) != (long *)0x0) {
    (**(code **)(**(long **)(lVar1 + 0x78) + 0x68))();
    return;
  }
  return;
}

Assistant:

QAnimationTimer *QAnimationTimer::instance(bool create)
{
    QAnimationTimer *inst;
#if QT_CONFIG(thread)
    static thread_local std::unique_ptr<QAnimationTimer> animationTimer;
    if (create && !animationTimer) {
        inst = new QAnimationTimer;
        animationTimer.reset(inst);
    } else {
        inst = animationTimer.get();
    }
#else
    Q_UNUSED(create);
    static QAnimationTimer animationTimer;
    inst = &animationTimer;
#endif
    return inst;
}